

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O1

Aig_Man_t * Saig_ManDupUnfoldConstrs(Aig_Man_t *pAig)

{
  long *plVar1;
  char *__s;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  Aig_Man_t *pAVar9;
  size_t sVar10;
  Aig_Obj_t *pAVar11;
  Vec_Ptr_t *pVVar12;
  Aig_Obj_t *p1;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  uint *puVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  Vec_Ptr_t *local_50;
  Vec_Ptr_t *local_48;
  uint *local_40;
  long *local_38;
  
  uVar13 = pAig->nTruePos;
  puVar5 = (uint *)malloc(0x10);
  uVar4 = 8;
  if (6 < uVar13 - 1) {
    uVar4 = uVar13;
  }
  puVar5[1] = 0;
  *puVar5 = uVar4;
  if (uVar4 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc((long)(int)uVar4 * 8);
  }
  *(void **)(puVar5 + 2) = pvVar6;
  local_40 = (uint *)malloc(0x10);
  local_40[1] = 0;
  *local_40 = uVar4;
  if (uVar4 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc((long)(int)uVar4 << 3);
  }
  *(void **)(local_40 + 2) = pvVar7;
  puVar19 = local_40;
  if (0 < pAig->nTruePos) {
    iVar17 = 0;
    do {
      if (pAig->vCos->nSize <= iVar17) goto LAB_006491cc;
      iVar3 = Saig_ManDetectConstr(pAig,iVar17,&local_48,&local_50);
      pVVar12 = local_48;
      if (iVar3 == 0) {
        if (local_48 != (Vec_Ptr_t *)0x0) {
          if (local_48->pArray != (void **)0x0) {
            free(local_48->pArray);
            local_48->pArray = (void **)0x0;
          }
          free(local_48);
          local_48 = (Vec_Ptr_t *)0x0;
        }
        if (local_50 != (Vec_Ptr_t *)0x0) {
          if (local_50->pArray != (void **)0x0) {
            free(local_50->pArray);
            local_50->pArray = (void **)0x0;
          }
          free(local_50);
          local_50 = (Vec_Ptr_t *)0x0;
        }
        uVar13 = puVar5[1];
        if (0 < (long)(int)uVar13) {
          lVar16 = 0;
          do {
            pvVar7 = *(void **)((long)pvVar6 + lVar16 * 8);
            if (pvVar7 != (void *)0x0) {
              if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar7 + 8));
                *(undefined8 *)((long)pvVar7 + 8) = 0;
              }
              free(pvVar7);
            }
            lVar16 = lVar16 + 1;
          } while ((int)uVar13 != lVar16);
        }
        if (*(void **)(puVar5 + 2) != (void *)0x0) {
          free(*(void **)(puVar5 + 2));
          puVar5[2] = 0;
          puVar5[3] = 0;
        }
        free(puVar5);
        puVar5 = local_40;
        if (*(void **)(local_40 + 2) != (void *)0x0) {
          free(*(void **)(local_40 + 2));
          puVar5[2] = 0;
          puVar5[3] = 0;
        }
        free(puVar5);
        goto LAB_00648e6d;
      }
      if (1 < (long)local_48->nSize) {
        qsort(local_48->pArray,(long)local_48->nSize,8,Saig_ManDupCompare);
      }
      pVVar2 = local_50;
      if (1 < (long)local_50->nSize) {
        qsort(local_50->pArray,(long)local_50->nSize,8,Saig_ManDupCompare);
      }
      uVar13 = puVar5[1];
      uVar4 = *puVar5;
      if (uVar13 == uVar4) {
        if ((int)uVar4 < 0x10) {
          if (*(void **)(puVar5 + 2) == (void *)0x0) {
            pvVar7 = malloc(0x80);
          }
          else {
            pvVar7 = realloc(*(void **)(puVar5 + 2),0x80);
          }
          uVar18 = 0x10;
        }
        else {
          uVar18 = uVar4 * 2;
          if ((int)uVar18 <= (int)uVar4) goto LAB_00648b29;
          if (*(void **)(puVar5 + 2) == (void *)0x0) {
            pvVar7 = malloc((ulong)uVar4 << 4);
          }
          else {
            pvVar7 = realloc(*(void **)(puVar5 + 2),(ulong)uVar4 << 4);
          }
        }
        *(void **)(puVar5 + 2) = pvVar7;
        *puVar5 = uVar18;
      }
LAB_00648b29:
      puVar19 = local_40;
      puVar5[1] = uVar13 + 1;
      *(Vec_Ptr_t **)(*(long *)(puVar5 + 2) + (long)(int)uVar13 * 8) = pVVar12;
      uVar13 = local_40[1];
      uVar4 = *local_40;
      if (uVar13 == uVar4) {
        if ((int)uVar4 < 0x10) {
          if (*(void **)(local_40 + 2) == (void *)0x0) {
            pvVar7 = malloc(0x80);
          }
          else {
            pvVar7 = realloc(*(void **)(local_40 + 2),0x80);
          }
          uVar18 = 0x10;
        }
        else {
          uVar18 = uVar4 * 2;
          if ((int)uVar18 <= (int)uVar4) goto LAB_00648b9e;
          if (*(void **)(local_40 + 2) == (void *)0x0) {
            pvVar7 = malloc((ulong)uVar4 << 4);
          }
          else {
            pvVar7 = realloc(*(void **)(local_40 + 2),(ulong)uVar4 << 4);
          }
        }
        *(void **)(puVar19 + 2) = pvVar7;
        *puVar19 = uVar18;
      }
LAB_00648b9e:
      puVar19[1] = uVar13 + 1;
      *(Vec_Ptr_t **)(*(long *)(puVar19 + 2) + (long)(int)uVar13 * 8) = pVVar2;
      iVar17 = iVar17 + 1;
    } while (iVar17 < pAig->nTruePos);
  }
  uVar20 = (ulong)(int)puVar19[1];
  if (0 < (long)uVar20) {
    plVar1 = *(long **)(puVar19 + 2);
    lVar16 = *plVar1;
    uVar8 = 0;
    do {
      if (*(int *)(plVar1[uVar8] + 4) != 0) {
        lVar16 = plVar1[uVar8];
      }
      uVar8 = uVar8 + 1;
    } while (uVar20 != uVar8);
    local_50 = (Vec_Ptr_t *)*plVar1;
    if (0 < (int)puVar5[1]) {
      bVar22 = true;
      uVar8 = 0;
      do {
        local_48 = *(Vec_Ptr_t **)(*(long *)(puVar5 + 2) + uVar8 * 8);
        if ((local_48->nSize != 1) || ((Aig_Obj_t *)*local_48->pArray != pAig->pConst1)) {
          uVar13 = *(uint *)(lVar16 + 4);
          if (uVar13 == local_50->nSize) {
            if (0 < (int)uVar13) {
              uVar14 = 0;
              do {
                if (*(void **)(*(long *)(lVar16 + 8) + uVar14 * 8) != local_50->pArray[uVar14])
                goto LAB_00648c91;
                uVar14 = uVar14 + 1;
              } while (uVar13 != uVar14);
            }
            goto LAB_00648c70;
          }
LAB_00648c91:
          if (bVar22) {
            puts("Collected constraints are not compatible.");
            uVar13 = puVar5[1];
            if (0 < (long)(int)uVar13) {
              lVar16 = *(long *)(puVar5 + 2);
              lVar15 = 0;
              do {
                pvVar6 = *(void **)(lVar16 + lVar15 * 8);
                if (pvVar6 != (void *)0x0) {
                  if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
                    free(*(void **)((long)pvVar6 + 8));
                    *(undefined8 *)((long)pvVar6 + 8) = 0;
                  }
                  free(pvVar6);
                }
                lVar15 = lVar15 + 1;
              } while ((int)uVar13 != lVar15);
            }
            if (*(void **)(puVar5 + 2) != (void *)0x0) {
              free(*(void **)(puVar5 + 2));
              puVar5[2] = 0;
              puVar5[3] = 0;
            }
            free(puVar5);
            puVar5 = local_40;
            lVar16 = 0;
            do {
              pvVar6 = (void *)plVar1[lVar16];
              if (pvVar6 != (void *)0x0) {
                if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
                  free(*(void **)((long)pvVar6 + 8));
                  *(undefined8 *)((long)pvVar6 + 8) = 0;
                }
                free(pvVar6);
              }
              lVar16 = lVar16 + 1;
            } while (uVar20 + (uVar20 == 0) != lVar16);
            free(plVar1);
            puVar5[2] = 0;
            puVar5[3] = 0;
            free(puVar5);
LAB_00648e6d:
            pAVar9 = Aig_ManDupDfs(pAig);
            return pAVar9;
          }
LAB_00648e8a:
          pAVar9 = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
          __s = pAig->pName;
          if (__s == (char *)0x0) {
            local_38 = (long *)0x0;
          }
          else {
            sVar10 = strlen(__s);
            local_38 = (long *)malloc(sVar10 + 1);
            strcpy((char *)local_38,__s);
          }
          pAVar9->pName = (char *)local_38;
          pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pAVar9->pConst1;
          pVVar12 = pAig->vCis;
          local_38 = plVar1;
          if (0 < pVVar12->nSize) {
            lVar15 = 0;
            do {
              pvVar6 = pVVar12->pArray[lVar15];
              pAVar11 = Aig_ObjCreateCi(pAVar9);
              *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar11;
              lVar15 = lVar15 + 1;
              pVVar12 = pAig->vCis;
            } while (lVar15 < pVVar12->nSize);
          }
          pVVar12 = pAig->vObjs;
          if (0 < pVVar12->nSize) {
            lVar15 = 0;
            do {
              pvVar6 = pVVar12->pArray[lVar15];
              if ((pvVar6 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar6 + 0x18) & 7) - 7)
                 ) {
                if (((ulong)pvVar6 & 1) != 0) goto LAB_0064919e;
                uVar8 = *(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe;
                if (uVar8 == 0) {
                  pAVar11 = (Aig_Obj_t *)0x0;
                }
                else {
                  pAVar11 = (Aig_Obj_t *)
                            ((ulong)((uint)*(ulong *)((long)pvVar6 + 8) & 1) ^
                            *(ulong *)(uVar8 + 0x28));
                }
                uVar8 = *(ulong *)((long)pvVar6 + 0x10) & 0xfffffffffffffffe;
                if (uVar8 == 0) {
                  p1 = (Aig_Obj_t *)0x0;
                }
                else {
                  p1 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar6 + 0x10) & 1) ^
                       *(ulong *)(uVar8 + 0x28));
                }
                pAVar11 = Aig_And(pAVar9,pAVar11,p1);
                *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar11;
              }
              lVar15 = lVar15 + 1;
              pVVar12 = pAig->vObjs;
            } while (lVar15 < pVVar12->nSize);
          }
          uVar13 = puVar5[1];
          if (0 < (int)uVar13) {
            lVar15 = 0;
            do {
              pVVar12 = *(Vec_Ptr_t **)(*(long *)(puVar5 + 2) + lVar15 * 8);
              pAVar11 = pAVar9->pConst1;
              local_48 = pVVar12;
              if (0 < pVVar12->nSize) {
                lVar21 = 0;
                do {
                  pAVar11 = Aig_And(pAVar9,pAVar11,
                                    (Aig_Obj_t *)
                                    ((ulong)((uint)pVVar12->pArray[lVar21] & 1) ^
                                     *(ulong *)(((ulong)pVVar12->pArray[lVar21] & 0xfffffffffffffffe
                                                ) + 0x28) ^ 1));
                  lVar21 = lVar21 + 1;
                } while (lVar21 < pVVar12->nSize);
              }
              Aig_ObjCreateCo(pAVar9,pAVar11);
              lVar15 = lVar15 + 1;
              uVar13 = puVar5[1];
            } while (lVar15 < (int)uVar13);
          }
          iVar17 = *(int *)(lVar16 + 4);
          pAVar9->nConstrs = iVar17;
          if (0 < iVar17) {
            lVar15 = 0;
            do {
              uVar8 = *(ulong *)(*(long *)(lVar16 + 8) + lVar15 * 8);
              Aig_ObjCreateCo(pAVar9,(Aig_Obj_t *)
                                     ((ulong)((uint)uVar8 & 1) ^
                                     *(ulong *)((uVar8 & 0xfffffffffffffffe) + 0x28)));
              lVar15 = lVar15 + 1;
            } while (lVar15 < *(int *)(lVar16 + 4));
          }
          if (pAig->nRegs < 1) {
LAB_006490b0:
            if (0 < (int)uVar13) {
              lVar16 = *(long *)(puVar5 + 2);
              uVar8 = 0;
              do {
                pvVar6 = *(void **)(lVar16 + uVar8 * 8);
                if (pvVar6 != (void *)0x0) {
                  if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
                    free(*(void **)((long)pvVar6 + 8));
                    *(undefined8 *)((long)pvVar6 + 8) = 0;
                  }
                  free(pvVar6);
                }
                uVar8 = uVar8 + 1;
              } while (uVar13 != uVar8);
            }
            if (*(void **)(puVar5 + 2) != (void *)0x0) {
              free(*(void **)(puVar5 + 2));
              puVar5[2] = 0;
              puVar5[3] = 0;
            }
            free(puVar5);
            plVar1 = local_38;
            lVar16 = 0;
            do {
              pvVar6 = (void *)plVar1[lVar16];
              if (pvVar6 != (void *)0x0) {
                if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
                  free(*(void **)((long)pvVar6 + 8));
                  *(undefined8 *)((long)pvVar6 + 8) = 0;
                }
                free(pvVar6);
              }
              lVar16 = lVar16 + 1;
            } while (uVar20 + (uVar20 == 0) != lVar16);
            free(plVar1);
            local_40[2] = 0;
            local_40[3] = 0;
            free(local_40);
            Aig_ManSetRegNum(pAVar9,pAig->nRegs);
            Aig_ManCleanup(pAVar9);
            Aig_ManSeqCleanup(pAVar9);
            return pAVar9;
          }
          iVar17 = 0;
          while ((uVar4 = pAig->nTruePos + iVar17, -1 < (int)uVar4 &&
                 ((int)uVar4 < pAig->vCos->nSize))) {
            pvVar6 = pAig->vCos->pArray[uVar4];
            if (((ulong)pvVar6 & 1) != 0) {
LAB_0064919e:
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                            ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
            }
            uVar8 = *(ulong *)((long)pvVar6 + 8);
            uVar14 = uVar8 & 0xfffffffffffffffe;
            if (uVar14 == 0) {
              pAVar11 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar11 = (Aig_Obj_t *)((ulong)((uint)uVar8 & 1) ^ *(ulong *)(uVar14 + 0x28));
            }
            Aig_ObjCreateCo(pAVar9,pAVar11);
            iVar17 = iVar17 + 1;
            if (pAig->nRegs <= iVar17) goto LAB_006490b0;
          }
          break;
        }
LAB_00648c70:
        uVar8 = uVar8 + 1;
        if (uVar8 == uVar20) goto LAB_00648e8a;
        bVar22 = uVar8 < uVar20;
        local_50 = (Vec_Ptr_t *)plVar1[uVar8];
      } while (uVar8 != puVar5[1]);
    }
  }
LAB_006491cc:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t * Saig_ManDupUnfoldConstrs( Aig_Man_t * pAig )
{
    Vec_Ptr_t * vOutsAll, * vConsAll;
    Vec_Ptr_t * vOuts, * vCons, * vCons0;
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pMiter, * pObj;
    int i, k, RetValue;
    // detect constraints for each output
    vOutsAll = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
    vConsAll = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
    Saig_ManForEachPo( pAig, pObj, i )
    {
        RetValue = Saig_ManDetectConstr( pAig, i, &vOuts, &vCons );
        if ( RetValue == 0 )
        {
            Vec_PtrFreeP( &vOuts );
            Vec_PtrFreeP( &vCons );
            Vec_VecFree( (Vec_Vec_t *)vOutsAll );
            Vec_VecFree( (Vec_Vec_t *)vConsAll );
            return Aig_ManDupDfs( pAig );
        }
        Vec_PtrSort( vOuts, (int (*)(void))Saig_ManDupCompare );
        Vec_PtrSort( vCons, (int (*)(void))Saig_ManDupCompare );
        Vec_PtrPush( vOutsAll, vOuts );
        Vec_PtrPush( vConsAll, vCons );
    }
    // check if constraints are compatible
    vCons0 = (Vec_Ptr_t *)Vec_PtrEntry( vConsAll, 0 );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vConsAll, vCons, i )
        if ( Vec_PtrSize(vCons) )
            vCons0 = vCons;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vConsAll, vCons, i )
    {
        // Constant 0 outputs are always compatible (vOuts stores the negation)
        vOuts = (Vec_Ptr_t *)Vec_PtrEntry( vOutsAll, i );
        if ( Vec_PtrSize(vOuts) == 1 && (Aig_Obj_t *)Vec_PtrEntry( vOuts, 0 ) == Aig_ManConst1(pAig) )
            continue;
        if ( !Vec_PtrEqual(vCons0, vCons) )
            break;
    }
    if ( i < Vec_PtrSize(vConsAll) )
    {
        printf( "Collected constraints are not compatible.\n" );
        Vec_VecFree( (Vec_Vec_t *)vOutsAll );
        Vec_VecFree( (Vec_Vec_t *)vConsAll );
        return Aig_ManDupDfs( pAig );
    }

    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // transform each output
    Vec_PtrForEachEntry( Vec_Ptr_t *, vOutsAll, vOuts, i )
    {
        // AND the outputs
        pMiter = Aig_ManConst1( pAigNew );
        Vec_PtrForEachEntry( Aig_Obj_t *, vOuts, pObj, k )
            pMiter = Aig_And( pAigNew, pMiter, Aig_Not(Aig_ObjRealCopy(pObj)) );
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // add constraints
    pAigNew->nConstrs = Vec_PtrSize(vCons0);
    Vec_PtrForEachEntry( Aig_Obj_t *, vCons0, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjRealCopy(pObj) );
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
//    Vec_PtrFreeP( &vOuts );
//    Vec_PtrFreeP( &vCons );
    Vec_VecFree( (Vec_Vec_t *)vOutsAll );
    Vec_VecFree( (Vec_Vec_t *)vConsAll );

    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    Aig_ManCleanup( pAigNew );
    Aig_ManSeqCleanup( pAigNew );
    return pAigNew;
}